

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O0

void __thiscall
HighsMipSolverData::runPresolve(HighsMipSolverData *this,HighsInt presolve_reduction_limit)

{
  bool bVar1;
  long *in_RDI;
  HPresolve presolve;
  HighsPresolveStatus in_stack_fffffffffffff910;
  HighsModelStatus in_stack_fffffffffffff914;
  HighsTimer *in_stack_fffffffffffff920;
  HighsInt in_stack_fffffffffffff934;
  undefined4 in_stack_fffffffffffff938;
  HighsInt in_stack_fffffffffffff93c;
  HPresolve *in_stack_fffffffffffff940;
  HighsPostsolveStack *in_stack_fffffffffffffa30;
  HPresolve *in_stack_fffffffffffffa38;
  
  HighsTimer::start(in_stack_fffffffffffff920,(HighsInt)((ulong)in_RDI >> 0x20));
  ::presolve::HPresolve::HPresolve
            ((HPresolve *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
  bVar1 = ::presolve::HPresolve::okSetInput
                    (in_stack_fffffffffffff940,
                     (HighsMipSolver *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938)
                     ,in_stack_fffffffffffff934);
  if (bVar1) {
    in_stack_fffffffffffff914 =
         ::presolve::HPresolve::run(in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
    *(HighsModelStatus *)(*in_RDI + 0x20) = in_stack_fffffffffffff914;
    in_stack_fffffffffffff910 =
         ::presolve::HPresolve::getPresolveStatus((HPresolve *)&stack0xfffffffffffff938);
    *(HighsPresolveStatus *)(in_RDI + 0xc0e) = in_stack_fffffffffffff910;
  }
  else {
    *(undefined4 *)(*in_RDI + 0x20) = 0x12;
    *(undefined4 *)(in_RDI + 0xc0e) = 9;
  }
  HighsTimer::stop((HighsTimer *)in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
  ::presolve::HPresolve::~HPresolve
            ((HPresolve *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
  return;
}

Assistant:

void HighsMipSolverData::runPresolve(const HighsInt presolve_reduction_limit) {
#ifdef HIGHS_DEBUGSOL
  bool debugSolActive = false;
  std::swap(debugSolution.debugSolActive, debugSolActive);
#endif

  mipsolver.timer_.start(mipsolver.timer_.presolve_clock);
  presolve::HPresolve presolve;
  if (!presolve.okSetInput(mipsolver, presolve_reduction_limit)) {
    mipsolver.modelstatus_ = HighsModelStatus::kMemoryLimit;
    presolve_status = HighsPresolveStatus::kOutOfMemory;
  } else {
    mipsolver.modelstatus_ = presolve.run(postSolveStack);
    presolve_status = presolve.getPresolveStatus();
  }
  mipsolver.timer_.stop(mipsolver.timer_.presolve_clock);

#ifdef HIGHS_DEBUGSOL
  debugSolution.debugSolActive = debugSolActive;
  if (debugSolution.debugSolActive) debugSolution.registerDomain(domain);
  assert(!debugSolution.debugSolActive ||
         checkSolution(debugSolution.debugSolution));
#endif
}